

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHeightfieldTerrainShape.cpp
# Opt level: O2

void __thiscall
cbtHeightfieldTerrainShape::initialize
          (cbtHeightfieldTerrainShape *this,int heightStickWidth,int heightStickLength,
          void *heightfieldData,cbtScalar heightScale,cbtScalar minHeight,cbtScalar maxHeight,
          int upAxis,PHY_ScalarType hdt,bool flipQuadEdges)

{
  undefined1 auVar1 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar2 [64];
  undefined1 auVar3 [56];
  undefined1 in_register_00001244 [60];
  undefined1 auVar4 [64];
  cbtScalar cVar5;
  float fVar6;
  cbtScalar cVar7;
  cbtVector3 cVar8;
  
  auVar4._4_60_ = in_register_00001244;
  auVar4._0_4_ = minHeight;
  auVar3 = in_register_00001204._4_56_;
  (this->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType = 0x1c;
  this->m_heightStickWidth = heightStickWidth;
  this->m_heightStickLength = heightStickLength;
  this->m_minHeight = minHeight;
  this->m_maxHeight = maxHeight;
  cVar5 = (cbtScalar)(heightStickWidth + -1);
  fVar6 = (float)(heightStickLength + -1);
  this->m_width = cVar5;
  this->m_length = fVar6;
  this->m_heightScale = heightScale;
  (this->field_10).m_heightfieldDataUnknown = heightfieldData;
  this->m_heightDataType = hdt;
  this->m_flipQuadEdges = flipQuadEdges;
  this->m_useDiamondSubdivision = false;
  this->m_useZigzagSubdivision = false;
  this->m_upAxis = upAxis;
  (this->m_localScaling).m_floats[0] = 1.0;
  (this->m_localScaling).m_floats[1] = 1.0;
  (this->m_localScaling).m_floats[2] = 1.0;
  (this->m_localScaling).m_floats[3] = 0.0;
  if (upAxis == 0) {
    auVar2 = ZEXT1664(auVar4._0_16_);
    minHeight = 0.0;
    auVar4 = ZEXT1264(ZEXT412(0));
    cVar7 = maxHeight;
  }
  else {
    cVar7 = cVar5;
    if (upAxis == 2) {
      auVar2 = ZEXT1264(ZEXT412(0));
      minHeight = 0.0;
      cVar5 = fVar6;
      fVar6 = maxHeight;
    }
    else {
      if (upAxis != 1) goto LAB_00e02248;
      auVar2 = ZEXT1264(ZEXT412(0));
      auVar4 = ZEXT1264(ZEXT412(0));
      cVar5 = maxHeight;
    }
  }
  auVar3 = auVar2._8_56_;
  (this->m_localAabbMin).m_floats[0] = auVar2._0_4_;
  (this->m_localAabbMin).m_floats[1] = minHeight;
  (this->m_localAabbMin).m_floats[2] = auVar4._0_4_;
  (this->m_localAabbMin).m_floats[3] = 0.0;
  (this->m_localAabbMax).m_floats[0] = cVar7;
  (this->m_localAabbMax).m_floats[1] = cVar5;
  (this->m_localAabbMax).m_floats[2] = fVar6;
  (this->m_localAabbMax).m_floats[3] = 0.0;
LAB_00e02248:
  cVar8 = ::operator+(&this->m_localAabbMin,&this->m_localAabbMax);
  auVar2._0_8_ = cVar8.m_floats._0_8_;
  auVar2._8_56_ = auVar3;
  auVar1._8_4_ = 0x3f000000;
  auVar1._0_8_ = 0x3f0000003f000000;
  auVar1._12_4_ = 0x3f000000;
  auVar1 = vmulps_avx512vl(auVar2._0_16_,auVar1);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)(cVar8.m_floats[2] * 0.5)),0x28);
  *(undefined1 (*) [16])(this->m_localOrigin).m_floats = auVar1;
  return;
}

Assistant:

void cbtHeightfieldTerrainShape::initialize(
	int heightStickWidth, int heightStickLength, const void* heightfieldData,
	cbtScalar heightScale, cbtScalar minHeight, cbtScalar maxHeight, int upAxis,
	PHY_ScalarType hdt, bool flipQuadEdges)
{
	// validation
	cbtAssert(heightStickWidth > 1);   // && "bad width");
	cbtAssert(heightStickLength > 1);  // && "bad length");
	cbtAssert(heightfieldData);        // && "null heightfield data");
	// cbtAssert(heightScale) -- do we care?  Trust caller here
	cbtAssert(minHeight <= maxHeight);                                    // && "bad min/max height");
	cbtAssert(upAxis >= 0 && upAxis < 3);                                 // && "bad upAxis--should be in range [0,2]");
	cbtAssert(hdt != PHY_UCHAR || hdt != PHY_FLOAT || hdt != PHY_SHORT);  // && "Bad height data type enum");

	// initialize member variables
	m_shapeType = TERRAIN_SHAPE_PROXYTYPE;
	m_heightStickWidth = heightStickWidth;
	m_heightStickLength = heightStickLength;
	m_minHeight = minHeight;
	m_maxHeight = maxHeight;
	m_width = (cbtScalar)(heightStickWidth - 1);
	m_length = (cbtScalar)(heightStickLength - 1);
	m_heightScale = heightScale;
	m_heightfieldDataUnknown = heightfieldData;
	m_heightDataType = hdt;
	m_flipQuadEdges = flipQuadEdges;
	m_useDiamondSubdivision = false;
	m_useZigzagSubdivision = false;
	m_upAxis = upAxis;
	m_localScaling.setValue(cbtScalar(1.), cbtScalar(1.), cbtScalar(1.));

	// determine min/max axis-aligned bounding box (aabb) values
	switch (m_upAxis)
	{
		case 0:
		{
			m_localAabbMin.setValue(m_minHeight, 0, 0);
			m_localAabbMax.setValue(m_maxHeight, m_width, m_length);
			break;
		}
		case 1:
		{
			m_localAabbMin.setValue(0, m_minHeight, 0);
			m_localAabbMax.setValue(m_width, m_maxHeight, m_length);
			break;
		};
		case 2:
		{
			m_localAabbMin.setValue(0, 0, m_minHeight);
			m_localAabbMax.setValue(m_width, m_length, m_maxHeight);
			break;
		}
		default:
		{
			//need to get valid m_upAxis
			cbtAssert(0);  // && "Bad m_upAxis");
		}
	}

	// remember origin (defined as exact middle of aabb)
	m_localOrigin = cbtScalar(0.5) * (m_localAabbMin + m_localAabbMax);
}